

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall ON_HermiteSurface::Create(ON_HermiteSurface *this,int u_count,int v_count)

{
  uint uVar1;
  double *pdVar2;
  ON_3dVector *pOVar3;
  double dVar4;
  ON_SimpleArray<ON_3dPoint> *this_00;
  ON_SimpleArray<ON_3dVector> *pOVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  Destroy(this);
  if (1 < v_count && 1 < u_count) {
    this->m_u_count = u_count;
    this->m_v_count = v_count;
    ON_SimpleArray<double>::SetCapacity(&this->m_u_parameters,(ulong)(uint)u_count);
    iVar8 = this->m_u_count;
    if ((-1 < (long)iVar8) && (iVar8 <= (this->m_u_parameters).m_capacity)) {
      (this->m_u_parameters).m_count = iVar8;
    }
    if (0 < iVar8) {
      pdVar2 = (this->m_u_parameters).m_a;
      lVar6 = 0;
      do {
        pdVar2[lVar6] = -1.23432101234321e+308;
        lVar6 = lVar6 + 1;
      } while (iVar8 != lVar6);
    }
    ON_SimpleArray<double>::SetCapacity(&this->m_v_parameters,(long)this->m_v_count);
    iVar8 = this->m_v_count;
    if ((-1 < (long)iVar8) && (iVar8 <= (this->m_v_parameters).m_capacity)) {
      (this->m_v_parameters).m_count = iVar8;
    }
    if (0 < iVar8) {
      pdVar2 = (this->m_v_parameters).m_a;
      lVar6 = 0;
      do {
        pdVar2[lVar6] = -1.23432101234321e+308;
        lVar6 = lVar6 + 1;
      } while (iVar8 != lVar6);
    }
    ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::SetCapacity
              (&this->m_grid_points,(long)this->m_u_count);
    iVar8 = this->m_u_count;
    if (0 < iVar8) {
      iVar7 = 0;
      do {
        this_00 = ON_ClassArray<ON_SimpleArray<ON_3dPoint>_>::AppendNew(&this->m_grid_points);
        ON_SimpleArray<ON_3dPoint>::SetCapacity(this_00,(long)this->m_v_count);
        iVar8 = this->m_v_count;
        uVar1 = this_00->m_capacity;
        if (iVar8 <= (int)uVar1 && -1 < iVar8) {
          this_00->m_count = iVar8;
        }
        if (0 < (int)uVar1 && this_00->m_a != (ON_3dPoint *)0x0) {
          memset(this_00->m_a,0,(ulong)uVar1 * 0x18);
        }
        iVar7 = iVar7 + 1;
        iVar8 = this->m_u_count;
      } while (iVar7 < iVar8);
    }
    ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity(&this->m_u_tangents,(long)iVar8);
    iVar8 = this->m_u_count;
    if (0 < iVar8) {
      iVar7 = 0;
      do {
        pOVar5 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::AppendNew(&this->m_u_tangents);
        ON_SimpleArray<ON_3dVector>::SetCapacity(pOVar5,(long)this->m_v_count);
        iVar8 = this->m_v_count;
        if ((-1 < iVar8) && (iVar8 <= pOVar5->m_capacity)) {
          pOVar5->m_count = iVar8;
        }
        if (0 < this->m_v_count) {
          lVar6 = 0;
          lVar9 = 0;
          do {
            ON_3dVector::operator=
                      ((ON_3dVector *)((long)&pOVar5->m_a->x + lVar6),&ON_3dPoint::UnsetPoint);
            lVar9 = lVar9 + 1;
            lVar6 = lVar6 + 0x18;
          } while (lVar9 < this->m_v_count);
        }
        iVar7 = iVar7 + 1;
        iVar8 = this->m_u_count;
      } while (iVar7 < iVar8);
    }
    ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity(&this->m_v_tangents,(long)iVar8);
    iVar8 = this->m_u_count;
    if (0 < iVar8) {
      iVar7 = 0;
      do {
        pOVar5 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::AppendNew(&this->m_v_tangents);
        ON_SimpleArray<ON_3dVector>::SetCapacity(pOVar5,(long)this->m_v_count);
        iVar8 = this->m_v_count;
        if ((-1 < iVar8) && (iVar8 <= pOVar5->m_capacity)) {
          pOVar5->m_count = iVar8;
        }
        if (0 < this->m_v_count) {
          lVar6 = 0;
          lVar9 = 0;
          do {
            pOVar3 = pOVar5->m_a;
            *(double *)((long)&pOVar3->z + lVar6) = ON_3dVector::UnsetVector.z;
            dVar4 = ON_3dVector::UnsetVector.y;
            pdVar2 = (double *)((long)&pOVar3->x + lVar6);
            *pdVar2 = ON_3dVector::UnsetVector.x;
            pdVar2[1] = dVar4;
            lVar9 = lVar9 + 1;
            lVar6 = lVar6 + 0x18;
          } while (lVar9 < this->m_v_count);
        }
        iVar7 = iVar7 + 1;
        iVar8 = this->m_u_count;
      } while (iVar7 < iVar8);
    }
    ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::SetCapacity(&this->m_twists,(long)iVar8);
    if (0 < this->m_u_count) {
      iVar8 = 0;
      do {
        pOVar5 = ON_ClassArray<ON_SimpleArray<ON_3dVector>_>::AppendNew(&this->m_twists);
        ON_SimpleArray<ON_3dVector>::SetCapacity(pOVar5,(long)this->m_v_count);
        iVar7 = this->m_v_count;
        if ((-1 < iVar7) && (iVar7 <= pOVar5->m_capacity)) {
          pOVar5->m_count = iVar7;
        }
        if (0 < this->m_v_count) {
          lVar6 = 0;
          lVar9 = 0;
          do {
            pOVar3 = pOVar5->m_a;
            *(double *)((long)&pOVar3->z + lVar6) = ON_3dVector::UnsetVector.z;
            dVar4 = ON_3dVector::UnsetVector.y;
            pdVar2 = (double *)((long)&pOVar3->x + lVar6);
            *pdVar2 = ON_3dVector::UnsetVector.x;
            pdVar2[1] = dVar4;
            lVar9 = lVar9 + 1;
            lVar6 = lVar6 + 0x18;
          } while (lVar9 < this->m_v_count);
        }
        iVar8 = iVar8 + 1;
      } while (iVar8 < this->m_u_count);
    }
  }
  return 1 < v_count && 1 < u_count;
}

Assistant:

bool ON_HermiteSurface::Create(int u_count, int v_count)
{
  Destroy();

  if (u_count < 2 || v_count < 2)
    return false;

  m_u_count = u_count;
  m_v_count = v_count;

  m_u_parameters.SetCapacity(m_u_count);
  m_u_parameters.SetCount(m_u_count);
  for (int i = 0; i < m_u_count; i++)
    m_u_parameters[i] = ON_UNSET_VALUE;

  m_v_parameters.SetCapacity(m_v_count);
  m_v_parameters.SetCount(m_v_count);
  for (int i = 0; i < m_v_count; i++)
    m_v_parameters[i] = ON_UNSET_VALUE;

  m_grid_points.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dPoint>& arr = m_grid_points.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    arr.Zero();
  }

  m_u_tangents.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dVector>& arr = m_u_tangents.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    for (int j = 0; j < m_v_count; j++)
      arr[j] = ON_3dPoint::UnsetPoint;
  }

  m_v_tangents.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dVector>& arr = m_v_tangents.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    for (int j = 0; j < m_v_count; j++)
      arr[j] = ON_3dVector::UnsetVector;
  }

  m_twists.SetCapacity(m_u_count);
  for (int i = 0; i < m_u_count; i++)
  {
    ON_SimpleArray<ON_3dVector>& arr = m_twists.AppendNew();
    arr.SetCapacity(m_v_count);
    arr.SetCount(m_v_count);
    for (int j = 0; j < m_v_count; j++)
      arr[j] = ON_3dVector::UnsetVector;
  }

  return true;
}